

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_x86.c
# Opt level: O3

void aes_init_x86(aes_context *ctx,uint8_t *key)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  __m128i _t;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ulong uVar35;
  __m128i _t_2;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  __m128i _t_1;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  
  auVar50 = *(undefined1 (*) [16])key;
  *(undefined1 (*) [16])ctx->key = auVar50;
  uVar35 = auVar50._0_8_;
  if (ctx->nr == 10) {
    auVar36._0_8_ = uVar35 << 0x20;
    auVar36._8_8_ = auVar50._8_8_ << 0x20 | uVar35 >> 0x20;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = SUB168(auVar36 ^ auVar50,0);
    auVar21 = aeskeygenassist(auVar50,1);
    auVar49._12_4_ = auVar21._12_4_;
    auVar49._4_4_ = auVar49._12_4_;
    auVar49._0_4_ = auVar49._12_4_;
    auVar49._8_4_ = auVar49._12_4_;
    auVar49 = auVar1 << 0x40 ^ auVar36 ^ auVar50 ^ auVar49;
    *(undefined1 (*) [16])(ctx->key + 4) = auVar49;
    auVar22._0_8_ = auVar49._0_8_ << 0x20;
    auVar22._8_8_ = auVar49._8_8_ << 0x20 | auVar49._0_8_ >> 0x20;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = SUB168(auVar22 ^ auVar49,0);
    auVar50 = aeskeygenassist(auVar49,2);
    auVar37._12_4_ = auVar50._12_4_;
    auVar37._4_4_ = auVar37._12_4_;
    auVar37._0_4_ = auVar37._12_4_;
    auVar37._8_4_ = auVar37._12_4_;
    auVar37 = auVar2 << 0x40 ^ auVar22 ^ auVar49 ^ auVar37;
    *(undefined1 (*) [16])(ctx->key + 8) = auVar37;
    auVar23._0_8_ = auVar37._0_8_ << 0x20;
    auVar23._8_8_ = auVar37._8_8_ << 0x20 | auVar37._0_8_ >> 0x20;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = SUB168(auVar23 ^ auVar37,0);
    auVar50 = aeskeygenassist(auVar37,4);
    auVar51._12_4_ = auVar50._12_4_;
    auVar51._4_4_ = auVar51._12_4_;
    auVar51._0_4_ = auVar51._12_4_;
    auVar51._8_4_ = auVar51._12_4_;
    auVar51 = auVar3 << 0x40 ^ auVar23 ^ auVar37 ^ auVar51;
    *(undefined1 (*) [16])(ctx->key + 0xc) = auVar51;
    auVar24._0_8_ = auVar51._0_8_ << 0x20;
    auVar24._8_8_ = auVar51._8_8_ << 0x20 | auVar51._0_8_ >> 0x20;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = SUB168(auVar24 ^ auVar51,0);
    auVar50 = aeskeygenassist(auVar51,8);
    auVar38._12_4_ = auVar50._12_4_;
    auVar38._4_4_ = auVar38._12_4_;
    auVar38._0_4_ = auVar38._12_4_;
    auVar38._8_4_ = auVar38._12_4_;
    auVar38 = auVar4 << 0x40 ^ auVar24 ^ auVar51 ^ auVar38;
    *(undefined1 (*) [16])(ctx->key + 0x10) = auVar38;
    auVar25._0_8_ = auVar38._0_8_ << 0x20;
    auVar25._8_8_ = auVar38._8_8_ << 0x20 | auVar38._0_8_ >> 0x20;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = SUB168(auVar25 ^ auVar38,0);
    auVar50 = aeskeygenassist(auVar38,0x10);
    auVar52._12_4_ = auVar50._12_4_;
    auVar52._4_4_ = auVar52._12_4_;
    auVar52._0_4_ = auVar52._12_4_;
    auVar52._8_4_ = auVar52._12_4_;
    auVar52 = auVar5 << 0x40 ^ auVar25 ^ auVar38 ^ auVar52;
    *(undefined1 (*) [16])(ctx->key + 0x14) = auVar52;
    auVar26._0_8_ = auVar52._0_8_ << 0x20;
    auVar26._8_8_ = auVar52._8_8_ << 0x20 | auVar52._0_8_ >> 0x20;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = SUB168(auVar26 ^ auVar52,0);
    auVar50 = aeskeygenassist(auVar52,0x20);
    auVar39._12_4_ = auVar50._12_4_;
    auVar39._4_4_ = auVar39._12_4_;
    auVar39._0_4_ = auVar39._12_4_;
    auVar39._8_4_ = auVar39._12_4_;
    auVar39 = auVar6 << 0x40 ^ auVar26 ^ auVar52 ^ auVar39;
    *(undefined1 (*) [16])(ctx->key + 0x18) = auVar39;
    auVar27._0_8_ = auVar39._0_8_ << 0x20;
    auVar27._8_8_ = auVar39._8_8_ << 0x20 | auVar39._0_8_ >> 0x20;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = SUB168(auVar27 ^ auVar39,0);
    auVar50 = aeskeygenassist(auVar39,0x40);
    auVar53._12_4_ = auVar50._12_4_;
    auVar53._4_4_ = auVar53._12_4_;
    auVar53._0_4_ = auVar53._12_4_;
    auVar53._8_4_ = auVar53._12_4_;
    auVar53 = auVar7 << 0x40 ^ auVar27 ^ auVar39 ^ auVar53;
    *(undefined1 (*) [16])(ctx->key + 0x1c) = auVar53;
    auVar28._0_8_ = auVar53._0_8_ << 0x20;
    auVar28._8_8_ = auVar53._8_8_ << 0x20 | auVar53._0_8_ >> 0x20;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = SUB168(auVar28 ^ auVar53,0);
    auVar50 = aeskeygenassist(auVar53,0x80);
    auVar40._12_4_ = auVar50._12_4_;
    auVar40._4_4_ = auVar40._12_4_;
    auVar40._0_4_ = auVar40._12_4_;
    auVar40._8_4_ = auVar40._12_4_;
    auVar40 = auVar8 << 0x40 ^ auVar28 ^ auVar53 ^ auVar40;
    *(undefined1 (*) [16])(ctx->key + 0x20) = auVar40;
    auVar29._0_8_ = auVar40._0_8_ << 0x20;
    auVar29._8_8_ = auVar40._8_8_ << 0x20 | auVar40._0_8_ >> 0x20;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = SUB168(auVar29 ^ auVar40,0);
    auVar50 = aeskeygenassist(auVar40,0x1b);
    auVar54._12_4_ = auVar50._12_4_;
    auVar54._4_4_ = auVar54._12_4_;
    auVar54._0_4_ = auVar54._12_4_;
    auVar54._8_4_ = auVar54._12_4_;
    auVar54 = auVar9 << 0x40 ^ auVar29 ^ auVar40 ^ auVar54;
    *(undefined1 (*) [16])(ctx->key + 0x24) = auVar54;
    auVar41._0_8_ = auVar54._0_8_ << 0x20;
    auVar41._8_8_ = auVar54._8_8_ << 0x20 | auVar54._0_8_ >> 0x20;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = SUB168(auVar41 ^ auVar54,0);
    auVar50 = aeskeygenassist(auVar54,0x36);
    auVar30._12_4_ = auVar50._12_4_;
    auVar30._4_4_ = auVar30._12_4_;
    auVar30._0_4_ = auVar30._12_4_;
    auVar30._8_4_ = auVar30._12_4_;
    auVar30 = auVar10 << 0x40 ^ auVar41 ^ auVar54 ^ auVar30;
  }
  else {
    auVar21 = *(undefined1 (*) [16])(key + 0x10);
    *(undefined1 (*) [16])(ctx->key + 4) = auVar21;
    auVar55._0_8_ = uVar35 << 0x20;
    auVar55._8_8_ = auVar50._8_8_ << 0x20 | uVar35 >> 0x20;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = SUB168(auVar55 ^ auVar50,0);
    auVar68 = aeskeygenassist(auVar21,1);
    auVar31._12_4_ = auVar68._12_4_;
    auVar31._4_4_ = auVar31._12_4_;
    auVar31._0_4_ = auVar31._12_4_;
    auVar31._8_4_ = auVar31._12_4_;
    auVar31 = auVar20 << 0x40 ^ auVar55 ^ auVar50 ^ auVar31;
    *(undefined1 (*) [16])(ctx->key + 8) = auVar31;
    auVar56._0_8_ = auVar21._0_8_ << 0x20;
    auVar56._8_8_ = auVar21._8_8_ << 0x20 | auVar21._0_8_ >> 0x20;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = SUB168(auVar56 ^ auVar21,0);
    auVar68 = aeskeygenassist(auVar31,0);
    auVar42._8_4_ = auVar68._8_4_;
    auVar42._4_4_ = auVar42._8_4_;
    auVar42._0_4_ = auVar42._8_4_;
    auVar42._12_4_ = auVar42._8_4_;
    auVar42 = auVar50 << 0x40 ^ auVar56 ^ auVar21 ^ auVar42;
    *(undefined1 (*) [16])(ctx->key + 0xc) = auVar42;
    auVar57._0_8_ = auVar31._0_8_ << 0x20;
    auVar57._8_8_ = auVar31._8_8_ << 0x20 | auVar31._0_8_ >> 0x20;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = SUB168(auVar57 ^ auVar31,0);
    auVar50 = aeskeygenassist(auVar42,2);
    auVar32._12_4_ = auVar50._12_4_;
    auVar32._4_4_ = auVar32._12_4_;
    auVar32._0_4_ = auVar32._12_4_;
    auVar32._8_4_ = auVar32._12_4_;
    auVar32 = auVar21 << 0x40 ^ auVar57 ^ auVar31 ^ auVar32;
    *(undefined1 (*) [16])(ctx->key + 0x10) = auVar32;
    auVar58._0_8_ = auVar42._0_8_ << 0x20;
    auVar58._8_8_ = auVar42._8_8_ << 0x20 | auVar42._0_8_ >> 0x20;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = SUB168(auVar58 ^ auVar42,0);
    auVar50 = aeskeygenassist(auVar32,0);
    auVar43._8_4_ = auVar50._8_4_;
    auVar43._4_4_ = auVar43._8_4_;
    auVar43._0_4_ = auVar43._8_4_;
    auVar43._12_4_ = auVar43._8_4_;
    auVar43 = auVar68 << 0x40 ^ auVar58 ^ auVar42 ^ auVar43;
    *(undefined1 (*) [16])(ctx->key + 0x14) = auVar43;
    auVar59._0_8_ = auVar32._0_8_ << 0x20;
    auVar59._8_8_ = auVar32._8_8_ << 0x20 | auVar32._0_8_ >> 0x20;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = SUB168(auVar59 ^ auVar32,0);
    auVar50 = aeskeygenassist(auVar43,4);
    auVar33._12_4_ = auVar50._12_4_;
    auVar33._4_4_ = auVar33._12_4_;
    auVar33._0_4_ = auVar33._12_4_;
    auVar33._8_4_ = auVar33._12_4_;
    auVar33 = auVar11 << 0x40 ^ auVar59 ^ auVar32 ^ auVar33;
    *(undefined1 (*) [16])(ctx->key + 0x18) = auVar33;
    auVar60._0_8_ = auVar43._0_8_ << 0x20;
    auVar60._8_8_ = auVar43._8_8_ << 0x20 | auVar43._0_8_ >> 0x20;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = SUB168(auVar60 ^ auVar43,0);
    auVar50 = aeskeygenassist(auVar33,0);
    auVar44._8_4_ = auVar50._8_4_;
    auVar44._4_4_ = auVar44._8_4_;
    auVar44._0_4_ = auVar44._8_4_;
    auVar44._12_4_ = auVar44._8_4_;
    auVar44 = auVar12 << 0x40 ^ auVar60 ^ auVar43 ^ auVar44;
    *(undefined1 (*) [16])(ctx->key + 0x1c) = auVar44;
    auVar61._0_8_ = auVar33._0_8_ << 0x20;
    auVar61._8_8_ = auVar33._8_8_ << 0x20 | auVar33._0_8_ >> 0x20;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = SUB168(auVar61 ^ auVar33,0);
    auVar50 = aeskeygenassist(auVar44,8);
    auVar34._12_4_ = auVar50._12_4_;
    auVar34._4_4_ = auVar34._12_4_;
    auVar34._0_4_ = auVar34._12_4_;
    auVar34._8_4_ = auVar34._12_4_;
    auVar34 = auVar13 << 0x40 ^ auVar61 ^ auVar33 ^ auVar34;
    *(undefined1 (*) [16])(ctx->key + 0x20) = auVar34;
    auVar62._0_8_ = auVar44._0_8_ << 0x20;
    auVar62._8_8_ = auVar44._8_8_ << 0x20 | auVar44._0_8_ >> 0x20;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = SUB168(auVar62 ^ auVar44,0);
    auVar50 = aeskeygenassist(auVar34,0);
    auVar45._8_4_ = auVar50._8_4_;
    auVar45._4_4_ = auVar45._8_4_;
    auVar45._0_4_ = auVar45._8_4_;
    auVar45._12_4_ = auVar45._8_4_;
    auVar45 = auVar14 << 0x40 ^ auVar62 ^ auVar44 ^ auVar45;
    *(undefined1 (*) [16])(ctx->key + 0x24) = auVar45;
    auVar63._0_8_ = auVar34._0_8_ << 0x20;
    auVar63._8_8_ = auVar34._8_8_ << 0x20 | auVar34._0_8_ >> 0x20;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = SUB168(auVar63 ^ auVar34,0);
    auVar50 = aeskeygenassist(auVar45,0x10);
    auVar69._12_4_ = auVar50._12_4_;
    auVar69._4_4_ = auVar69._12_4_;
    auVar69._0_4_ = auVar69._12_4_;
    auVar69._8_4_ = auVar69._12_4_;
    auVar30 = auVar15 << 0x40 ^ auVar63 ^ auVar34 ^ auVar69;
    auVar64._0_8_ = auVar45._0_8_ << 0x20;
    auVar64._8_8_ = auVar45._8_8_ << 0x20 | auVar45._0_8_ >> 0x20;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = SUB168(auVar64 ^ auVar45,0);
    auVar50 = aeskeygenassist(auVar30,0);
    auVar46._8_4_ = auVar50._8_4_;
    auVar46._4_4_ = auVar46._8_4_;
    auVar46._0_4_ = auVar46._8_4_;
    auVar46._12_4_ = auVar46._8_4_;
    auVar46 = auVar16 << 0x40 ^ auVar64 ^ auVar45 ^ auVar46;
    *(undefined1 (*) [16])(ctx->key + 0x2c) = auVar46;
    auVar65._0_8_ = auVar30._0_8_ << 0x20;
    auVar65._8_8_ = auVar30._8_8_ << 0x20 | auVar30._0_8_ >> 0x20;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = SUB168(auVar65 ^ auVar30,0);
    auVar50 = aeskeygenassist(auVar46,0x20);
    auVar70._12_4_ = auVar50._12_4_;
    auVar70._4_4_ = auVar70._12_4_;
    auVar70._0_4_ = auVar70._12_4_;
    auVar70._8_4_ = auVar70._12_4_;
    auVar70 = auVar17 << 0x40 ^ auVar65 ^ auVar30 ^ auVar70;
    *(undefined1 (*) [16])(ctx->key + 0x30) = auVar70;
    auVar66._0_8_ = auVar46._0_8_ << 0x20;
    auVar66._8_8_ = auVar46._8_8_ << 0x20 | auVar46._0_8_ >> 0x20;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = SUB168(auVar66 ^ auVar46,0);
    auVar50 = aeskeygenassist(auVar70,0);
    auVar47._8_4_ = auVar50._8_4_;
    auVar47._4_4_ = auVar47._8_4_;
    auVar47._0_4_ = auVar47._8_4_;
    auVar47._12_4_ = auVar47._8_4_;
    auVar47 = auVar18 << 0x40 ^ auVar66 ^ auVar46 ^ auVar47;
    *(undefined1 (*) [16])(ctx->key + 0x34) = auVar47;
    auVar67._0_8_ = auVar70._0_8_ << 0x20;
    auVar67._8_8_ = auVar70._8_8_ << 0x20 | auVar70._0_8_ >> 0x20;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = SUB168(auVar67 ^ auVar70,0);
    auVar50 = aeskeygenassist(auVar47,0x40);
    auVar48._12_4_ = auVar50._12_4_;
    auVar48._4_4_ = auVar48._12_4_;
    auVar48._0_4_ = auVar48._12_4_;
    auVar48._8_4_ = auVar48._12_4_;
    *(undefined1 (*) [16])(ctx->key + 0x38) = auVar19 << 0x40 ^ auVar67 ^ auVar70 ^ auVar48;
  }
  *(undefined1 (*) [16])(ctx->key + 0x28) = auVar30;
  return;
}

Assistant:

void aes_init_x86(aes_context* ctx, const uint8_t* key)
{
  __m128i* ekey = (__m128i*)ctx->key;

  if (ctx->nr == 10) {
    ekey[0] = _mm_loadu_si128((const __m128i*)key);
    AES_INIT_128(ekey, 0, 0x01);
    AES_INIT_128(ekey, 1, 0x02);
    AES_INIT_128(ekey, 2, 0x04);
    AES_INIT_128(ekey, 3, 0x08);
    AES_INIT_128(ekey, 4, 0x10);
    AES_INIT_128(ekey, 5, 0x20);
    AES_INIT_128(ekey, 6, 0x40);
    AES_INIT_128(ekey, 7, 0x80);
    AES_INIT_128(ekey, 8, 0x1b);
    AES_INIT_128(ekey, 9, 0x36);
  } else {
    ekey[0] = _mm_loadu_si128((const __m128i*)key);
    ekey[1] = _mm_loadu_si128((const __m128i*)(key+16));
    AES_INIT_256(ekey, 0,  0xFF, 0x01);
    AES_INIT_256(ekey, 1,  0xAA, 0x00);
    AES_INIT_256(ekey, 2,  0xFF, 0x02);
    AES_INIT_256(ekey, 3,  0xAA, 0x00);
    AES_INIT_256(ekey, 4,  0xFF, 0x04);
    AES_INIT_256(ekey, 5,  0xAA, 0x00);
    AES_INIT_256(ekey, 6,  0xFF, 0x08);
    AES_INIT_256(ekey, 7,  0xAA, 0x00);
    AES_INIT_256(ekey, 8,  0xFF, 0x10);
    AES_INIT_256(ekey, 9,  0xAA, 0x00);
    AES_INIT_256(ekey, 10, 0xFF, 0x20);
    AES_INIT_256(ekey, 11, 0xAA, 0x00);
    AES_INIT_256(ekey, 12, 0xFF, 0x40);
  }
}